

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::InputFile(InputFile *this,InputPartData *part)

{
  void *pvVar1;
  GenericInputFile *in_RDI;
  InputPartData *in_stack_ffffffffffffffb8;
  InputFile *in_stack_ffffffffffffffc0;
  Data *this_00;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__InputFile_00561f60;
  this_00 = (Data *)(in_RDI + 1);
  pvVar1 = operator_new(0x108);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  (this_00->super_Mutex).super___mutex_base._M_mutex.__align = (long)pvVar1;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x20) = 0;
  multiPartInitialize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

InputFile::InputFile (InputPartData* part) :
    _data (new Data (part->numThreads))
{
    _data->_deleteStream=false;
    try
    {
       multiPartInitialize (part);
    }
    catch(...)
    {
        delete _data;
        throw;
    }
}